

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcursor.cpp
# Opt level: O1

QCursorData *
QCursorData::setBitmap(QBitmap *bitmap,QBitmap *mask,int hotX,int hotY,qreal devicePixelRatio)

{
  double dVar1;
  int iVar2;
  QSize QVar3;
  QSize QVar4;
  QCursorData *pQVar5;
  QPixmap *pQVar6;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  initialize();
  iVar2 = QPixmap::depth(&bitmap->super_QPixmap);
  if (iVar2 == 1) {
    iVar2 = QPixmap::depth(&mask->super_QPixmap);
    if (iVar2 == 1) {
      QVar3 = QPixmap::size(&bitmap->super_QPixmap);
      QVar4 = QPixmap::size(&mask->super_QPixmap);
      if (QVar3 == QVar4) {
        pQVar5 = (QCursorData *)operator_new(0x38);
        (pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i = 1;
        *(undefined8 *)&pQVar5->cshape = 0;
        *(undefined8 *)((long)&pQVar5->bm + 4) = 0;
        *(undefined4 *)((long)&pQVar5->bmm + 4) = 0;
        QPixmap::QPixmap(&pQVar5->pixmap);
        pQVar5->hx = 0;
        pQVar5->hy = 0;
        pQVar6 = (QPixmap *)operator_new(0x18);
        QPixmap::QPixmap(pQVar6,&bitmap->super_QPixmap);
        (pQVar6->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&PTR__QBitmap_007e27c0;
        pQVar5->bm = (QBitmap *)pQVar6;
        pQVar6 = (QPixmap *)operator_new(0x18);
        QPixmap::QPixmap(pQVar6,&mask->super_QPixmap);
        (pQVar6->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&PTR__QBitmap_007e27c0;
        pQVar5->bmm = (QBitmap *)pQVar6;
        pQVar5->cshape = BitmapCursor;
        if (hotX < 0) {
          iVar2 = QPixmap::width(&bitmap->super_QPixmap);
          dVar1 = (double)(iVar2 / 2) / devicePixelRatio;
        }
        else {
          dVar1 = (double)hotX;
        }
        pQVar5->hx = (short)(int)dVar1;
        if (hotY < 0) {
          iVar2 = QPixmap::height(&bitmap->super_QPixmap);
          dVar1 = (double)(iVar2 / 2) / devicePixelRatio;
        }
        else {
          dVar1 = (double)hotY;
        }
        pQVar5->hy = (short)(int)dVar1;
        goto LAB_002c05ae;
      }
    }
  }
  local_58[0] = '\x02';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_40 = "default";
  QMessageLogger::warning(local_58,"QCursor: Cannot create bitmap cursor; invalid bitmap(s)");
  pQVar5 = qt_cursorTable[0];
  LOCK();
  (qt_cursorTable[0]->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (qt_cursorTable[0]->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
LAB_002c05ae:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QCursorData *QCursorData::setBitmap(const QBitmap &bitmap, const QBitmap &mask, int hotX, int hotY, qreal devicePixelRatio)
{
    QCursorData::initialize();
    if (bitmap.depth() != 1 || mask.depth() != 1 || bitmap.size() != mask.size()) {
        qWarning("QCursor: Cannot create bitmap cursor; invalid bitmap(s)");
        QCursorData *c = qt_cursorTable[0];
        c->ref.ref();
        return c;
    }
    QCursorData *d = new QCursorData;
    d->bm  = new QBitmap(bitmap);
    d->bmm = new QBitmap(mask);
    d->cshape = Qt::BitmapCursor;
    d->hx = hotX >= 0 ? hotX : bitmap.width() / 2 / devicePixelRatio;
    d->hy = hotY >= 0 ? hotY : bitmap.height() / 2 / devicePixelRatio;

    return d;
}